

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,Xform *xform,uint32_t indent,
          bool closing_brace)

{
  bool bVar1;
  ostream *poVar2;
  uint32_t indent_00;
  string *psVar3;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  uint32_t n_03;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [379];
  byte local_1d;
  uint local_1c;
  bool closing_brace_local;
  tinyusdz *ptStack_18;
  uint32_t indent_local;
  Xform *xform_local;
  
  local_1c = (uint)xform;
  local_1d = (byte)indent & 1;
  psVar3 = __return_storage_ptr__;
  ptStack_18 = this;
  xform_local = (Xform *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  indent_00 = (uint32_t)psVar3;
  pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_1c8);
  to_string_abi_cxx11_(&local_1e8,(tinyusdz *)(ulong)*(uint *)(ptStack_18 + 0xa98),s);
  poVar2 = ::std::operator<<(poVar2,(string *)&local_1e8);
  poVar2 = ::std::operator<<(poVar2," Xform \"");
  poVar2 = ::std::operator<<(poVar2,(string *)(ptStack_18 + 0xa78));
  ::std::operator<<(poVar2,"\"\n");
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  bVar1 = PrimMetas::authored((PrimMetas *)(ptStack_18 + 0x1a10));
  n_02 = n_00;
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)(ulong)local_1c,n_00);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_208);
    ::std::operator<<(poVar2,"(\n");
    ::std::__cxx11::string::~string((string *)&local_208);
    print_prim_metas_abi_cxx11_
              (&local_228,ptStack_18 + 0x1a10,(PrimMeta *)(ulong)(local_1c + 1),indent_00);
    ::std::operator<<(aoStack_198,(string *)&local_228);
    ::std::__cxx11::string::~string((string *)&local_228);
    pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)local_1c,n_01);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_248);
    ::std::operator<<(poVar2,")\n");
    ::std::__cxx11::string::~string((string *)&local_248);
    n_02 = extraout_EDX;
  }
  pprint::Indent_abi_cxx11_(&local_268,(pprint *)(ulong)local_1c,n_02);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_268);
  ::std::operator<<(poVar2,"{\n");
  ::std::__cxx11::string::~string((string *)&local_268);
  print_gprim_predefined<tinyusdz::Xform>(&local_288,(Xform *)ptStack_18,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_288);
  ::std::__cxx11::string::~string((string *)&local_288);
  print_props(&local_2a8,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(ptStack_18 + 0x1970),local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_2a8);
  ::std::__cxx11::string::~string((string *)&local_2a8);
  if ((local_1d & 1) != 0) {
    pprint::Indent_abi_cxx11_(&local_2c8,(pprint *)(ulong)local_1c,n_03);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_2c8);
    ::std::operator<<(poVar2,"}\n");
    ::std::__cxx11::string::~string((string *)&local_2c8);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Xform &xform, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(xform.spec) << " Xform \""
     << xform.name << "\"\n";
  if (xform.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(xform.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  ss << print_gprim_predefined(xform, indent + 1);

  ss << print_props(xform.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}